

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.cpp
# Opt level: O0

bool __thiscall
axl::xml::ExpatParserRoot::createNs(ExpatParserRoot *this,StringRef *encoding,char separator)

{
  bool bVar1;
  C *pCVar2;
  char in_DL;
  int in_ESI;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  uint_t unaff_retaddr;
  undefined1 unaff_retaddr_00;
  undefined1 unaff_retaddr_01;
  
  sl::Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>::
  close((Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_> *
        )in_RDI,in_ESI);
  pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::szn(in_RDI);
  pCVar2 = (C *)XML_ParserCreateNS(pCVar2,(int)in_DL);
  in_RDI->m_p = pCVar2;
  bVar1 = err::completeWithSystemError<bool>
                    ((bool)unaff_retaddr_01,(bool)unaff_retaddr_00,unaff_retaddr);
  return bVar1;
}

Assistant:

bool
ExpatParserRoot::createNs(
	const sl::StringRef& encoding,
	char separator
) {
	close();

	m_h = XML_ParserCreateNS(encoding.szn(), separator);
	return err::completeWithSystemError(m_h != NULL, false, err::SystemErrorCode_InsufficientResources);
}